

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeArraySet(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  value_type *pvVar2;
  Expression *ref_00;
  Expression *value_00;
  ArraySet *ifTrue;
  optional<wasm::Type> type_00;
  optional<wasm::Type> local_b8;
  ArraySet *local_a8;
  ArraySet *set;
  BoundsCheck check;
  Expression *value;
  Expression *ref;
  Expression *local_58;
  Expression *index;
  Type local_40;
  Type elementType;
  value_type arrayType;
  BasicType local_24;
  TranslateToFuzzReader *local_20;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  local_24 = none;
  local_20 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  bVar1 = Type::operator==((Type *)&this_local,&local_24);
  if (bVar1) {
    bVar1 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::empty
                      (&this->mutableArrays);
    if (bVar1) {
      type_local.id = (uintptr_t)makeTrivial(this,(Type)this_local);
    }
    else {
      pvVar2 = pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                         (this,&this->mutableArrays);
      elementType.id = pvVar2->id;
      ::wasm::HeapType::getArray();
      local_40.id = (uintptr_t)index;
      Type::Type((Type *)&ref,i32);
      local_58 = make(this,(Type)ref);
      ref_00 = makeTrappingRefUse(this,(HeapType)elementType.id);
      check.getLength = (Expression *)local_40.id;
      value_00 = make(this,local_40);
      if (((this->allowOOB & 1U) == 0) || (bVar1 = oneIn(this,10), !bVar1)) {
        makeArrayBoundsCheck
                  ((BoundsCheck *)&set,ref_00,local_58,this->funcContext->func,&this->builder,
                   (Expression *)0x0);
        ifTrue = Builder::makeArraySet(&this->builder,check.condition,check.getRef,value_00);
        local_a8 = ifTrue;
        std::optional<wasm::Type>::optional(&local_b8);
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._9_7_ = 0;
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             local_b8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Type>._M_payload;
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_engaged =
             local_b8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Type>._M_engaged;
        type_local.id =
             (uintptr_t)
             Builder::makeIf(&this->builder,(Expression *)set,(Expression *)ifTrue,(Expression *)0x0
                             ,type_00);
      }
      else {
        type_local.id = (uintptr_t)Builder::makeArraySet(&this->builder,ref_00,local_58,value_00);
      }
    }
    return (Expression *)type_local.id;
  }
  __assert_fail("type == Type::none",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0x13bf,"Expression *wasm::TranslateToFuzzReader::makeArraySet(Type)");
}

Assistant:

Expression* TranslateToFuzzReader::makeArraySet(Type type) {
  assert(type == Type::none);
  if (mutableArrays.empty()) {
    return makeTrivial(type);
  }
  auto arrayType = pick(mutableArrays);
  auto elementType = arrayType.getArray().element.type;
  auto* index = make(Type::i32);
  auto* ref = makeTrappingRefUse(arrayType);
  auto* value = make(elementType);
  // Only rarely emit a plain get which might trap. See related logic in
  // ::makePointer().
  if (allowOOB && oneIn(10)) {
    return builder.makeArraySet(ref, index, value);
  }
  // To avoid a trap, check the length dynamically using this pattern:
  //
  //   if (index < array.len) array[index] = value;
  //
  auto check = makeArrayBoundsCheck(ref, index, funcContext->func, builder);
  auto* set = builder.makeArraySet(check.getRef, check.getIndex, value);
  return builder.makeIf(check.condition, set);
}